

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.cc
# Opt level: O2

void __thiscall Exttpose::tpose(Exttpose *this)

{
  DbaseCtrlBlk *pDVar1;
  vector<char,_std::allocator<char>_> *this_00;
  long *plVar2;
  pointer puVar3;
  int iVar4;
  uint uVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pcVar8;
  char cVar9;
  ostream *poVar10;
  pointer piVar11;
  ExttposeArgument *pEVar12;
  runtime_error *prVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  Exttpose *pEVar17;
  int iVar18;
  int *piVar19;
  long lVar20;
  long lVar21;
  unsigned_long uVar22;
  unsigned_long uVar23;
  long lVar24;
  vector<int,_std::allocator<int>_> *this_01;
  int iVar25;
  double dVar26;
  int custid;
  int numitem;
  int tid;
  int *buf;
  Exttpose *local_898;
  DbaseCtrlBlk *local_890;
  ulong local_888;
  long local_880;
  undefined8 local_878;
  ulong local_870;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_868;
  long local_860;
  ulong local_858;
  ulong local_850;
  int local_844;
  vector<TransArray,std::allocator<TransArray>> *local_840;
  vector<int,_std::allocator<int>_> *local_838;
  vector<int,_std::allocator<int>_> *local_830;
  int l2cnt;
  int null;
  undefined4 uStack_804;
  undefined8 local_800;
  undefined1 local_7f8 [16];
  string tmpiset;
  int file_offset;
  ofstream ofd;
  byte abStack_598 [480];
  string tmpnam;
  ostringstream tmpnamestrm;
  
  std::ofstream::ofstream(&ofd);
  pDVar1 = &this->dcb;
  DbaseCtrlBlk::get_first_blk(pDVar1);
  DbaseCtrlBlk::get_next_trans(pDVar1,&buf,&numitem,&tid,&custid);
  local_870 = (ulong)(uint)custid;
  local_890 = pDVar1;
  while ((this->dcb).readall != '\x01') {
    piVar11 = (this->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pEVar12 = this->args;
    piVar6 = (this->itcnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->ocnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar21 = 0; lVar21 < numitem; lVar21 = lVar21 + 1) {
      piVar19 = piVar11 + buf[lVar21];
      *piVar19 = *piVar19 + 1;
      if ((pEVar12->use_seq != 0) && (piVar7[buf[lVar21]] != custid)) {
        piVar19 = piVar6 + buf[lVar21];
        *piVar19 = *piVar19 + 1;
        piVar7[buf[lVar21]] = custid;
      }
    }
    DbaseCtrlBlk::get_next_trans(local_890,&buf,&numitem,&tid,&custid);
  }
  local_888 = (ulong)(uint)custid;
  poVar10 = std::operator<<((ostream *)&this->env->logger,"MINMAX ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_870);
  poVar10 = std::operator<<(poVar10," ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_888);
  std::endl<char,std::char_traits<char>>(poVar10);
  iVar18 = 0;
  iVar25 = 0;
  for (lVar21 = 0; pEVar12 = this->args, lVar21 < pEVar12->DBASE_MAXITEM; lVar21 = lVar21 + 1) {
    if (pEVar12->use_seq == 0) {
      piVar11 = (this->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((long)piVar11[lVar21] < pEVar12->MINSUPPORT) goto LAB_001065de;
      uVar22 = this->numfreq;
      (this->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar21] = (int)uVar22;
      this->numfreq = uVar22 + 1;
      iVar4 = piVar11[lVar21];
      iVar25 = iVar25 + iVar4;
      iVar18 = (iVar18 - iVar4) + pEVar12->DBASE_NUM_TRANS;
    }
    else if ((long)(this->itcnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar21] < pEVar12->MINSUPPORT) {
LAB_001065de:
      (this->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar21] = -1;
    }
    else {
      poVar10 = (ostream *)std::ostream::operator<<(&this->env->logger,(int)lVar21);
      poVar10 = std::operator<<(poVar10," SUPP ");
      poVar10 = (ostream *)
                std::ostream::operator<<
                          (poVar10,(this->itcnt).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar21]);
      std::endl<char,std::char_traits<char>>(poVar10);
      uVar22 = this->numfreq;
      (this->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar21] = (int)uVar22;
      this->numfreq = uVar22 + 1;
    }
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->backidx,this->numfreq);
  this->numfreq = 0;
  pEVar12 = this->args;
  piVar11 = (this->itcnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar6 = (this->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (this->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar22 = 0;
  for (lVar21 = 0; lVar21 < pEVar12->DBASE_MAXITEM; lVar21 = lVar21 + 1) {
    if (pEVar12->use_seq == 0) {
      iVar4 = piVar7[lVar21];
    }
    else {
      iVar4 = piVar11[lVar21];
    }
    uVar23 = uVar22;
    if (pEVar12->MINSUPPORT <= (long)iVar4) {
      uVar23 = uVar22 + 1;
      this->numfreq = uVar23;
      piVar6[uVar22] = (int)lVar21;
    }
    uVar22 = uVar23;
  }
  poVar10 = std::operator<<((ostream *)&this->env->logger,"numfreq ");
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  poVar10 = std::operator<<(poVar10," :  ");
  poVar10 = std::operator<<(poVar10," SUMSUP SUMDIFF = ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar25);
  poVar10 = std::operator<<(poVar10," ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar18);
  std::endl<char,std::char_traits<char>>(poVar10);
  poVar10 = std::operator<<((ostream *)&this->env->summary," F1stats = [ ");
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  poVar10 = std::operator<<(poVar10," ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar25);
  poVar10 = std::operator<<(poVar10," ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar18);
  std::operator<<(poVar10," ]");
  if (this->numfreq != 0) {
    local_878 = 4;
    local_860 = (long)((ulong)this->args->AMEM / this->numfreq) / 4;
    poVar10 = std::operator<<((ostream *)&this->env->logger,"EXTRARYSZ ");
    poVar10 = std::ostream::_M_insert<long>((long)poVar10);
    std::endl<char,std::char_traits<char>>(poVar10);
    if (local_860 < 2) {
      local_860 = 2;
    }
    local_840 = (vector<TransArray,std::allocator<TransArray>> *)&this->extary;
    std::vector<TransArray,_std::allocator<TransArray>_>::reserve
              ((vector<TransArray,_std::allocator<TransArray>_> *)local_840,this->numfreq);
    local_898 = this;
    for (uVar16 = 0; uVar16 < local_898->numfreq; uVar16 = uVar16 + 1) {
      std::vector<TransArray,std::allocator<TransArray>>::emplace_back<long&,int&>
                (local_840,&local_860,&local_898->args->num_partitions);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmpnamestrm);
    pEVar12 = local_898->args;
    iVar18 = pEVar12->num_partitions;
    dVar26 = ceil((double)(((int)local_888 - (int)local_870) + 1) / (double)iVar18);
    pEVar17 = local_898;
    local_858 = (ulong)(uint)(int)dVar26;
    if (pEVar12->do_invert != 0) {
      if (1 < iVar18) {
        DbaseCtrlBlk::get_first_blk(local_890);
        DbaseCtrlBlk::get_next_trans(local_890,&buf,&numitem,&tid,&custid);
      }
      local_868 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                  CONCAT44(local_868._4_4_,(int)local_870 + (int)local_858);
      local_880 = CONCAT44(local_880._4_4_,(int)local_888 + 1);
      for (lVar21 = 0; lVar21 < pEVar17->args->num_partitions; lVar21 = lVar21 + 1) {
        std::operator<<((ostream *)&tmpnamestrm,(string *)&pEVar17->args->idxfn);
        pEVar17 = local_898;
        if (1 < local_898->args->num_partitions) {
          poVar10 = std::operator<<((ostream *)&tmpnamestrm,".P");
          std::ostream::operator<<(poVar10,(int)lVar21);
          iVar18 = (int)lVar21 * (int)local_858 + (int)local_868;
          piVar6 = (pEVar17->itcnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (piVar11 = (pEVar17->itcnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start; piVar11 != piVar6; piVar11 = piVar11 + 1)
          {
            *piVar11 = 0;
          }
          piVar6 = (pEVar17->ocnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (piVar11 = (pEVar17->ocnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start; piVar11 != piVar6; piVar11 = piVar11 + 1)
          {
            *piVar11 = -1;
          }
          piVar6 = (pEVar17->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (piVar11 = (pEVar17->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start; piVar11 != piVar6; piVar11 = piVar11 + 1)
          {
            *piVar11 = 0;
          }
          if ((int)local_888 < iVar18) {
            iVar18 = (int)local_880;
          }
          while (((pEVar17->dcb).readall != '\x01' && (custid < iVar18))) {
            piVar11 = (pEVar17->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pEVar12 = pEVar17->args;
            piVar6 = (pEVar17->itcnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar7 = (pEVar17->ocnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            for (lVar24 = 0; lVar24 < numitem; lVar24 = lVar24 + 1) {
              piVar19 = piVar11 + buf[lVar24];
              *piVar19 = *piVar19 + 1;
              if ((pEVar12->use_seq != 0) && (piVar7[buf[lVar24]] != custid)) {
                piVar19 = piVar6 + buf[lVar24];
                *piVar19 = *piVar19 + 1;
                piVar7[buf[lVar24]] = custid;
              }
            }
            DbaseCtrlBlk::get_next_trans(local_890,&buf,&numitem,&tid,&custid);
          }
        }
        std::__cxx11::stringbuf::str();
        poVar10 = std::operator<<((ostream *)&pEVar17->env->logger,"OPENED ");
        poVar10 = std::operator<<(poVar10,(string *)&tmpnam);
        std::endl<char,std::char_traits<char>>(poVar10);
        std::ofstream::open((string *)&ofd,(_Ios_Openmode)&tmpnam);
        if ((abStack_598[*(long *)(_ofd + -0x18)] & 5) != 0) {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &file_offset,"Can\'t open file ",&tmpnam);
          std::runtime_error::runtime_error(prVar13,(string *)&file_offset);
          __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        file_offset = 0;
        _null = (undefined1 *)CONCAT44(uStack_804,0xffffffff);
        for (lVar24 = 0; lVar24 < pEVar17->args->DBASE_MAXITEM; lVar24 = lVar24 + 1) {
          if ((pEVar17->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar24] == -1) {
            piVar19 = &file_offset;
            if (pEVar17->args->no_minus_off == '\0') {
              piVar19 = &null;
            }
            std::ostream::write((char *)&ofd,(long)piVar19);
          }
          else {
            std::ostream::write((char *)&ofd,(long)&file_offset);
            *(long *)(*(long *)&(pEVar17->extary).
                                super__Vector_base<TransArray,_std::allocator<TransArray>_>._M_impl.
                                super__Vector_impl_data._M_start
                                [(pEVar17->freqidx).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar24]].offset.
                                super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data + lVar21 * 8) = (long)file_offset;
            pEVar12 = pEVar17->args;
            if (pEVar12->use_seq == 0) {
              if (pEVar12->use_diff == '\0') {
                file_offset = (pEVar17->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start[lVar24] + file_offset;
              }
              else {
                file_offset = (pEVar12->DBASE_NUM_TRANS + file_offset) -
                              (pEVar17->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start[lVar24];
              }
            }
            else if (pEVar12->use_newformat == '\0') {
              file_offset = file_offset +
                            (pEVar17->itcnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar24] * 2 +
                            (pEVar17->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar24];
            }
            else {
              file_offset = file_offset +
                            (pEVar17->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar24] * 2;
            }
          }
        }
        poVar10 = std::operator<<((ostream *)&pEVar17->env->logger,"OFF ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)lVar24);
        poVar10 = std::operator<<(poVar10," ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,file_offset);
        std::endl<char,std::char_traits<char>>(poVar10);
        std::ostream::write((char *)&ofd,(long)&file_offset);
        std::ofstream::close();
        std::__cxx11::string::~string((string *)&tmpnam);
      }
    }
    pEVar17 = local_898;
    poVar10 = std::operator<<((ostream *)&local_898->env->logger,"Wrote Offt ");
    std::endl<char,std::char_traits<char>>(poVar10);
    local_838 = &pEVar17->fidx;
    std::vector<int,_std::allocator<int>_>::resize(local_838,pEVar17->numfreq);
    pEVar12 = pEVar17->args;
    if (pEVar12->do_l2 != 0) {
      std::fstream::fstream(&tmpnam);
      std::fstream::fstream(&file_offset);
      _null = local_7f8;
      local_800 = 0;
      local_7f8[0] = 0;
      tmpiset._M_dataplus._M_p = (pointer)&tmpiset.field_2;
      tmpiset._M_string_length = 0;
      tmpiset.field_2._M_local_buf[0] = '\0';
      pEVar12 = pEVar17->args;
      if (pEVar12->use_seq != 0) {
        std::__cxx11::string::_M_assign((string *)&null);
        std::fstream::open((string *)&file_offset,(_Ios_Openmode)&null);
        cVar9 = std::__basic_file<char>::is_open();
        if (cVar9 == '\0') {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar13,"Can\'t open out file");
          goto LAB_001073c7;
        }
        pEVar12 = pEVar17->args;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&l2cnt,
                     &pEVar12->tmpfn,"iset");
      std::__cxx11::string::operator=((string *)&tmpiset,(string *)&l2cnt);
      std::__cxx11::string::~string((string *)&l2cnt);
      std::fstream::open((string *)&tmpnam,(_Ios_Openmode)&tmpiset);
      pDVar1 = local_890;
      cVar9 = std::__basic_file<char>::is_open();
      if (cVar9 == '\0') {
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar13,"Can\'t open out file");
LAB_001073c7:
        __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (pEVar17->args->use_seq != 0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                  (&pEVar17->seq2,pEVar17->numfreq * pEVar17->numfreq);
      }
      local_868 = &pEVar17->itcnt2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (local_868,pEVar17->numfreq * (pEVar17->numfreq - 1) >> 1);
      this_00 = &pEVar17->ocust;
      std::vector<char,_std::allocator<char>_>::resize
                (this_00,pEVar17->numfreq * (pEVar17->numfreq - 1) >> 1);
      this_01 = &pEVar17->offsets;
      std::vector<int,_std::allocator<int>_>::resize(this_01,pEVar17->numfreq);
      iVar18 = (int)pEVar17->numfreq;
      lVar21 = (long)iVar18;
      piVar11 = (pEVar17->offsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + (pEVar17->numfreq - lVar21);
      iVar25 = 0;
      for (; iVar18 = iVar18 + -1, 0 < lVar21; lVar21 = lVar21 + -1) {
        *piVar11 = iVar25;
        iVar25 = iVar25 + iVar18;
        piVar11 = piVar11 + 1;
      }
      DbaseCtrlBlk::get_first_blk(pDVar1);
      DbaseCtrlBlk::get_next_trans(pDVar1,&buf,&numitem,&tid,&custid);
      local_830 = this_01;
      while ((pEVar17->dcb).readall != '\x01') {
        local_850 = 0;
        local_844 = custid;
        while (((pEVar17->dcb).readall != '\x01' && (local_844 == custid))) {
          lVar21 = 4;
          uVar16 = 1;
          iVar18 = numitem;
          for (lVar24 = 0; lVar24 < iVar18; lVar24 = lVar24 + 1) {
            uVar5 = (pEVar17->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[buf[lVar24]];
            lVar14 = (long)(int)uVar5;
            lVar20 = lVar21;
            if (lVar14 != -1) {
              local_880 = lVar21;
              if (pEVar17->args->use_seq == 0) {
                iVar25 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[lVar14];
                for (uVar15 = uVar16 & 0xffffffff; pEVar17 = local_898, lVar20 = local_880,
                    this_01 = local_830, (int)uVar15 < iVar18; uVar15 = (ulong)((int)uVar15 + 1)) {
                  iVar18 = (local_898->freqidx).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[*(int *)((long)buf + lVar21)];
                  if (iVar18 != -1) {
                    puVar3 = (local_868->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start +
                             (int)(iVar18 + ~uVar5 + iVar25);
                    *puVar3 = *puVar3 + '\x01';
                    if (*puVar3 == '\0') {
                      std::ostream::write(tmpnam.field_2._M_local_buf,(long)(buf + lVar24));
                      std::ostream::write(tmpnam.field_2._M_local_buf,(long)buf + lVar21);
                    }
                  }
                  lVar21 = lVar21 + 4;
                  iVar18 = numitem;
                }
              }
              else {
                plVar2 = (long *)(*(long *)local_840 + lVar14 * 0x48);
                if (*(int *)(*(long *)local_840 + 0x20 + lVar14 * 0x48) == 0) {
                  (local_838->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[(int)local_850] = uVar5;
                  local_850 = (ulong)((int)local_850 + 1);
                  piVar19 = (int *)*plVar2;
                  *piVar19 = tid;
                  piVar19[1] = tid;
                  *(undefined4 *)(plVar2 + 4) = 2;
                }
                else {
                  *(int *)(*plVar2 + 4) = tid;
                }
                iVar25 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[lVar14];
                for (uVar15 = uVar16; iVar18 = numitem, (int)uVar15 < numitem; uVar15 = uVar15 + 1)
                {
                  iVar18 = (pEVar17->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[buf[uVar15]];
                  if (iVar18 != -1) {
                    (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_start[(int)(iVar18 + ~uVar5 + iVar25)] = '\x01';
                  }
                }
              }
            }
            uVar16 = uVar16 + 1;
            lVar21 = lVar20 + 4;
          }
          DbaseCtrlBlk::get_next_trans(local_890,&buf,&numitem,&tid,&custid);
        }
        if (pEVar17->args->use_seq != 0) {
          process_cust(pEVar17,(int)local_850,(fstream *)&file_offset,(fstream *)&tmpnam);
        }
      }
      pcVar8 = (pEVar17->ocust).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pEVar17->ocust).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish != pcVar8) {
        (pEVar17->ocust).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcVar8;
      }
      poVar10 = std::operator<<((ostream *)&pEVar17->env->logger,"2-IT ");
      poVar10 = std::operator<<(poVar10," ");
      std::endl<char,std::char_traits<char>>(poVar10);
      l2cnt = 0;
      pEVar12 = pEVar17->args;
      if (pEVar12->use_seq == 0) {
        iVar18 = 0;
      }
      else {
        std::ofstream::open((string *)&ofd,(int)pEVar12 + 0xa0);
        if ((abStack_598[*(long *)(_ofd + -0x18)] & 5) != 0) {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar13,"Can\'t open seq file");
          __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        sort_get_l2(pEVar17,&l2cnt,(fstream *)&file_offset,&ofd,&pEVar17->seq2,false);
        std::ofstream::close();
        poVar10 = std::operator<<((ostream *)&pEVar17->env->logger,"SEQ2 cnt ");
        iVar18 = l2cnt;
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,l2cnt);
        std::endl<char,std::char_traits<char>>(poVar10);
        poVar10 = std::operator<<((ostream *)&pEVar17->env->summary," ");
        std::ostream::operator<<(poVar10,iVar18);
        pEVar12 = pEVar17->args;
      }
      std::ofstream::open((string *)&ofd,(int)pEVar12 + 0x80);
      if ((abStack_598[*(long *)(_ofd + -0x18)] & 5) != 0) {
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar13,"Can\'t open it2 file");
        __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      sort_get_l2(pEVar17,&l2cnt,(fstream *)&tmpnam,&ofd,local_868,false);
      std::ofstream::close();
      poVar10 = std::operator<<((ostream *)&pEVar17->env->logger,"SORT ");
      iVar25 = l2cnt;
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,l2cnt);
      poVar10 = std::operator<<(poVar10,"  ");
      std::endl<char,std::char_traits<char>>(poVar10);
      poVar10 = std::operator<<((ostream *)&pEVar17->env->summary," F2stats = [");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar25);
      poVar10 = std::operator<<(poVar10," ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar18);
      std::operator<<(poVar10," ]");
      piVar11 = (pEVar17->offsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((pEVar17->offsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar11) {
        (pEVar17->offsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar11;
      }
      puVar3 = (pEVar17->itcnt2).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((pEVar17->itcnt2).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar3) {
        (pEVar17->itcnt2).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar3;
      }
      puVar3 = (pEVar17->seq2).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((pEVar17->seq2).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar3) {
        (pEVar17->seq2).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar3;
      }
      std::__cxx11::string::~string((string *)&tmpiset);
      std::__cxx11::string::~string((string *)&null);
      std::fstream::~fstream(&file_offset);
      std::fstream::~fstream(&tmpnam);
      pEVar12 = pEVar17->args;
    }
    if (pEVar12->do_invert != 0) {
      do_invert_db(pEVar17,(int)local_858,(int)local_870,(int)local_888);
    }
    piVar11 = (pEVar17->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((pEVar17->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar11) {
      (pEVar17->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar11;
    }
    piVar11 = (pEVar17->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((pEVar17->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar11) {
      (pEVar17->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar11;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmpnamestrm);
  }
  std::ofstream::~ofstream(&ofd);
  return;
}

Assistant:

void Exttpose::tpose() {
    int i, j, l;
    int idx;
    int custid, tid, numitem, fcnt;
    ofstream ofd;
    int sumsup = 0, sumdiff = 0;

    //count 1 items
    int *buf;
    dcb.get_first_blk();
    dcb.get_next_trans(buf, numitem, tid, custid);
    int mincustid = custid;
    while (!dcb.eof()) {
        //env.logger << custid << " " << tid << " " << numitem;
        for (j = 0; j < numitem; j++) {
            //env.logger << " " << buf[j] << flush;
            itlen[buf[j]]++;
            if (args.use_seq && ocnt[buf[j]] != custid) {
                itcnt[buf[j]]++;
                ocnt[buf[j]] = custid;
            }
            //if (buf[j] == 17) env.logger << " " << tid;
        }
        //env.logger << endl;
        dcb.get_next_trans(buf, numitem, tid, custid);
    }
    //env.logger << endl;
    int maxcustid = static_cast<int>(custid);
    env.logger << "MINMAX " << mincustid << " " << maxcustid << endl;

    for (i = 0; i < args.DBASE_MAXITEM; i++) {
        if (args.use_seq) {
            if (itcnt[i] >= args.MINSUPPORT) {
                env.logger << i << " SUPP " << itcnt[i] << endl;
                freqidx[i] = numfreq;
                numfreq++;
            } else freqidx[i] = static_cast<int>(-1);
        } else {
            if (itlen[i] >= args.MINSUPPORT) {
                freqidx[i] = numfreq;
                numfreq++;
                sumsup += itlen[i];
                sumdiff += (args.DBASE_NUM_TRANS - itlen[i]);
            } else freqidx[i] = static_cast<int>(-1);
        }
        //if (i == 17) env.logger << " 17 SUP " << itlen[17] << endl;
    }

    backidx.resize(numfreq);

    numfreq = 0;
    for (i = 0; i < args.DBASE_MAXITEM; i++) {
        if (args.use_seq) {
            if (itcnt[i] >= args.MINSUPPORT)
                backidx[numfreq++] = i;
        } else {
            if (itlen[i] >= args.MINSUPPORT)
                backidx[numfreq++] = i;
        }
    }

    env.logger << "numfreq " << numfreq << " :  " << " SUMSUP SUMDIFF = " << sumsup << " " << sumdiff << endl;

    env.summary << " F1stats = [ " << numfreq << " " << sumsup << " " << sumdiff << " ]";

    if (numfreq == 0) return;

    long extarysz = args.AMEM / numfreq;
    extarysz /= INT_SIZE;
    env.logger << "EXTRARYSZ " << extarysz << endl;
    if (extarysz < 2) extarysz = 2;

    extary.reserve(numfreq);

    for (i = 0; i < numfreq; i++) {
        extary.emplace_back(extarysz, args.num_partitions);
    }

    ostringstream tmpnamestrm;
    int plb, pub, pblk;
    pblk = static_cast<int>(ceil(((double) (maxcustid - mincustid + 1)) / args.num_partitions));
    if (args.do_invert) {
        if (args.num_partitions > 1) {
            dcb.get_first_blk();
            dcb.get_next_trans(buf, numitem, tid, custid);
        }
        for (j = 0; j < args.num_partitions; j++) {
            //construct offsets for 1-itemsets
            tmpnamestrm << args.idxfn;
            if (args.num_partitions > 1) {
                tmpnamestrm << ".P" << j;
                plb = j * pblk + mincustid;
                pub = plb + pblk;
                if (pub > maxcustid) pub = maxcustid + 1;
                std::fill(itcnt.begin(), itcnt.end(), 0);
                std::fill(ocnt.begin(), ocnt.end(), -1);
                std::fill(itlen.begin(), itlen.end(), 0);

                for (; !dcb.eof() && custid < pub;) {
                    for (i = 0; i < numitem; i++) {
                        itlen[buf[i]]++;
                        if (args.use_seq && ocnt[buf[i]] != custid) {
                            itcnt[buf[i]]++;
                            ocnt[buf[i]] = custid;
                        }
                    }
                    dcb.get_next_trans(buf, numitem, tid, custid);
                }
            }
            string tmpnam = tmpnamestrm.str();
            env.logger << "OPENED " << tmpnam << endl;
            ofd.open(tmpnam, ios::binary);
            if (!ofd) {
                throw runtime_error("Can't open file " + tmpnam);
            }

            int file_offset = 0;
            int null = -1;
            for (i = 0; i < args.DBASE_MAXITEM; i++) {
                //if (i == 17) env.logger << "LIDX " << i << " " << itlen[i] << endl;
                if (freqidx[i] != -1) {
                    ofd.write((char *) &file_offset, INT_SIZE);
                    extary[freqidx[i]].set_offset(file_offset, j);
                    if (args.use_seq) {
                        if (args.use_newformat) file_offset += (2 * itlen[i]);
                        else file_offset += (2 * itcnt[i] + itlen[i]);
                    } else {
                        if (args.use_diff) file_offset += (args.DBASE_NUM_TRANS - itlen[i]);
                        else file_offset += itlen[i];
                    }
                } else if (args.no_minus_off) {
                    ofd.write((char *) &file_offset, INT_SIZE);
                } else ofd.write((char *) &null, INT_SIZE);
                //env.logger << "OFF " << i <<" " << file_offset << endl;
            }
            env.logger << "OFF " << i << " " << file_offset << endl;
            ofd.write((char *) &file_offset, INT_SIZE);
            ofd.close();
        }
    }

    env.logger << "Wrote Offt " << endl;

    fidx.resize(numfreq);

    int ocid = -1;
    if (args.do_l2) {
        fstream isetfd;
        fstream seqfd;
        string tmpseq, tmpiset;

        if (args.use_seq) {
            tmpseq = args.tmpfn;
            seqfd.open(tmpseq, ios::binary | ios::trunc);
            if (!seqfd.is_open()) {
                throw runtime_error("Can't open out file");
            }
        }
        tmpiset = args.tmpfn + "iset";
        isetfd.open(tmpiset, ios::binary | ios::trunc);

        if (!isetfd.is_open()) {
            throw runtime_error("Can't open out file");
        }

        if (args.use_seq) {
            seq2.reserve(numfreq * numfreq);
        }

        itcnt2.resize(numfreq * (numfreq - 1) / 2);
        ocust.resize(numfreq * (numfreq - 1) / 2);
        offsets.resize(numfreq);

        int offt = 0;
        int start = static_cast<int>(numfreq);
        for (i = start - 1; i >= 0; i--) {
            offsets[numfreq - i - 1] = offt;
            offt += i;
        }

        ocid = -1;
        int lit;
        //count 2-itemsets
        dcb.get_first_blk();
        dcb.get_next_trans(buf, numitem, tid, custid);
        while (!dcb.eof()) {
            fcnt = 0;
            ocid = custid;
            while (!dcb.eof() && ocid == custid) {
                for (j = 0; j < numitem; j++) {
                    idx = freqidx[buf[j]];
                    if (idx != -1) {
                        if (args.use_seq) {
                            if (extary[idx].size() == 0) {
                                fidx[fcnt] = idx;
                                fcnt++;
                                //extary[idx].add(isetfd,tid,args.use_seq,0);
                                //extary[idx].add(isetfd,tid,args.use_seq,0);
                                extary[idx].setitem(0, tid);
                                extary[idx].setitem(1, tid);
                                extary[idx].setsize(2);
                            } else {
                                extary[idx].setitem(1, tid);
                            }

                            lit = offsets[idx] - idx - 1;
                            for (l = j + 1; l < numitem; l++) {
                                if (freqidx[buf[l]] != -1) {
                                    ocust[lit + freqidx[buf[l]]] = 1;
                                }
                            }
                        } else {
                            lit = offsets[idx] - idx - 1;
                            for (l = j + 1; l < numitem; l++) {
                                if (freqidx[buf[l]] != -1) {
                                    if ((++itcnt2[lit + freqidx[buf[l]]]) == 0) {
                                        isetfd.write((char *) &buf[j], INT_SIZE);
                                        isetfd.write((char *) &buf[l], INT_SIZE);
                                    }
                                }
                            }
                        }
                    }
                }
                dcb.get_next_trans(buf, numitem, tid, custid);
            }

            if (args.use_seq) {
                process_cust(fcnt, seqfd, isetfd);
            }
        }
        ocust.clear();
        env.logger << "2-IT " << " " << endl;

        //write 2-itemsets counts to file
        int l2cnt = 0;
        if (args.use_seq) {
            ofd.open(args.seqfn, ios::binary);
            if (ofd.fail()) {
                throw runtime_error("Can't open seq file");
            }
            sort_get_l2(l2cnt, seqfd, ofd, seq2, true);

            ofd.close();
            env.logger << "SEQ2 cnt " << l2cnt << endl;
            env.summary << " " << l2cnt;
        }
        int seqs = l2cnt;

        ofd.open(args.it2fn, ios::binary);
        //if ((fd = open(args.it2fn, (O_WRONLY|O_CREAT|O_TRUNC|O_BINARY), 0666)) < 0){
        if (ofd.fail()) {
            throw runtime_error("Can't open it2 file");
        }
        sort_get_l2(l2cnt, isetfd, ofd, itcnt2, false);
        ofd.close();
        env.logger << "SORT " << l2cnt << "  " << endl;

        env.summary << " F2stats = [" << l2cnt << " " << seqs << " ]";
        offsets.clear();
        itcnt2.clear();
        seq2.clear();
    }

    if (args.do_invert) {
        do_invert_db(pblk, mincustid, maxcustid);
    }

    freqidx.clear();
    backidx.clear();
}